

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O3

void ImGui::AlignTextToFramePadding(void)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  ImGuiContext *pIVar9;
  
  pIVar9 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  if (pIVar4->SkipItems == false) {
    fVar1 = (pIVar9->Style).FramePadding.y;
    fVar2 = (pIVar4->DC).CurrLineSize.y;
    fVar3 = (pIVar4->DC).CurrLineTextBaseOffset;
    auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40000000),0),ZEXT416((uint)fVar1),
                             ZEXT416((uint)pIVar9->FontSize));
    uVar5 = vcmpss_avx512f(auVar8,ZEXT416((uint)fVar2),2);
    bVar6 = (bool)((byte)uVar5 & 1);
    uVar5 = vcmpss_avx512f(ZEXT416((uint)fVar1),ZEXT416((uint)fVar3),2);
    bVar7 = (bool)((byte)uVar5 & 1);
    (pIVar4->DC).CurrLineSize.y = (float)((uint)bVar6 * (int)fVar2 + (uint)!bVar6 * auVar8._0_4_);
    (pIVar4->DC).CurrLineTextBaseOffset =
         (float)((uint)bVar7 * (int)fVar3 + (uint)!bVar7 * (int)fVar1);
  }
  return;
}

Assistant:

inline    ImGuiWindow*  GetCurrentWindow()          { ImGuiContext& g = *GImGui; g.CurrentWindow->WriteAccessed = true; return g.CurrentWindow; }